

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shuffling.hpp
# Opt level: O2

void Shell::Shuffling::shuffleTwoList<unsigned_int,Kernel::TermList>
               (List<unsigned_int> **list1,List<Kernel::TermList> **list2)

{
  uint len;
  uint uVar1;
  List<unsigned_int> *pLVar2;
  List<Kernel::TermList> *pLVar3;
  List<unsigned_int> **ppLVar4;
  long lVar5;
  List<Kernel::TermList> **ppLVar6;
  DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_> aux;
  DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_> DStack_48;
  
  len = Lib::List<unsigned_int>::length(*list1);
  if (1 < len) {
    Lib::DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_>::DArray
              (&DStack_48,(ulong)len);
    ppLVar4 = list1;
    ppLVar6 = list2;
    uVar1 = 0;
    while (pLVar2 = *ppLVar4, pLVar2 != (List<unsigned_int> *)0x0) {
      pLVar3 = *ppLVar6;
      DStack_48._array[uVar1].first = pLVar2;
      DStack_48._array[uVar1].second = pLVar3;
      ppLVar6 = &pLVar3->_tail;
      uVar1 = uVar1 + 1;
      ppLVar4 = &pLVar2->_tail;
    }
    shuffleArray<Lib::DArray<std::pair<Lib::List<unsigned_int>*,Lib::List<Kernel::TermList>*>>>
              (&DStack_48,len);
    pLVar2 = (List<unsigned_int> *)0x0;
    pLVar3 = (List<Kernel::TermList> *)0x0;
    for (lVar5 = 0; (ulong)len << 4 != lVar5; lVar5 = lVar5 + 0x10) {
      pLVar2 = Lib::List<unsigned_int>::cons
                         (**(uint **)((long)&(DStack_48._array)->first + lVar5),pLVar2);
      pLVar3 = Lib::List<Kernel::TermList>::cons
                         ((TermList)**(uint64_t **)((long)&(DStack_48._array)->second + lVar5),
                          pLVar3);
    }
    *list1 = pLVar2;
    *list2 = pLVar3;
    Lib::DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_>::~DArray
              (&DStack_48);
  }
  return;
}

Assistant:

static void shuffleTwoList(List<T>*& list1, List<S>*& list2) {
    unsigned len = List<T>::length(list1);

    if (len <= 1) {
      return;
    }

    DArray<std::pair<List<T>*,List<S>*>> aux(len);
    unsigned idx = 0;

    List<T>* els1 = list1;
    List<S>* els2 = list2;
    while (els1 != nullptr) {
      ASS_NEQ(els2,0);
      aux[idx++] = std::make_pair(els1,els2);
      els1 = els1->tail();
      els2 = els2->tail();
    }
    ASS_EQ(els2,0);
    shuffleArray(aux,len);

    // create the new lists
    List<T>* res1 = nullptr;
    List<S>* res2 = nullptr;
    for(idx = 0; idx < len; idx++) {
      res1 = List<T>::cons(aux[idx].first->head(),res1);
      res2 = List<S>::cons(aux[idx].second->head(),res2);
    }

    // List<T>::destroy(list1);
    // List<S>::destroy(list2);

    list1 = res1;
    list2 = res2;
  }